

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

char * __thiscall
CoreML::Specification::FunctionDescription::_InternalParse
          (FunctionDescription *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  ParseContext *pPVar1;
  bool bVar2;
  string *psVar3;
  FeatureDescription *pFVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  string *str_2;
  string *str_1;
  string *str;
  ParseContext *pPStack_20;
  uint32_t tag;
  ParseContext *ctx_local;
  char *ptr_local;
  FunctionDescription *this_local;
  
  pPStack_20 = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
LAB_002a06fc:
  do {
    bVar2 = google::protobuf::internal::ParseContext::Done(pPStack_20,(char **)&ctx_local);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      return (char *)ctx_local;
    }
    ctx_local = (ParseContext *)
                google::protobuf::internal::ReadTag
                          ((char *)ctx_local,(uint32_t *)((long)&str + 4),0);
    tag_00 = str._4_4_;
    switch(str._4_4_ >> 3) {
    case 1:
      if ((str._4_4_ & 0xff) != 10) break;
      psVar3 = _internal_mutable_name_abi_cxx11_(this);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::InlineGreedyStringParser
                            (psVar3,(char *)ctx_local,pPStack_20);
      bVar2 = google::protobuf::internal::VerifyUTF8(psVar3,(char *)0x0);
joined_r0x002a0976:
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        return (char *)(ParseContext *)0x0;
      }
      goto joined_r0x002a07a5;
    case 2:
      if ((str._4_4_ & 0xff) == 0x12) {
        ctx_local = (ParseContext *)((long)&ctx_local[-1].data_.arena + 7);
        do {
          pPVar1 = pPStack_20;
          ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 1);
          pFVar4 = _internal_add_input(this);
          ctx_local = (ParseContext *)
                      google::protobuf::internal::ParseContext::ParseMessage
                                (pPVar1,&pFVar4->super_MessageLite,(char *)ctx_local);
          if (ctx_local == (ParseContext *)0x0) {
            return (char *)(ParseContext *)0x0;
          }
          bVar2 = google::protobuf::internal::EpsCopyInputStream::DataAvailable
                            (&pPStack_20->super_EpsCopyInputStream,(char *)ctx_local);
        } while ((bVar2) &&
                (bVar2 = google::protobuf::internal::ExpectTag<18u>((char *)ctx_local), bVar2));
        goto LAB_002a06fc;
      }
      break;
    case 3:
      if ((str._4_4_ & 0xff) == 0x1a) {
        ctx_local = (ParseContext *)((long)&ctx_local[-1].data_.arena + 7);
        do {
          pPVar1 = pPStack_20;
          ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 1);
          pFVar4 = _internal_add_output(this);
          ctx_local = (ParseContext *)
                      google::protobuf::internal::ParseContext::ParseMessage
                                (pPVar1,&pFVar4->super_MessageLite,(char *)ctx_local);
          if (ctx_local == (ParseContext *)0x0) {
            return (char *)(ParseContext *)0x0;
          }
          bVar2 = google::protobuf::internal::EpsCopyInputStream::DataAvailable
                            (&pPStack_20->super_EpsCopyInputStream,(char *)ctx_local);
        } while ((bVar2) &&
                (bVar2 = google::protobuf::internal::ExpectTag<26u>((char *)ctx_local), bVar2));
        goto LAB_002a06fc;
      }
      break;
    case 4:
      if ((str._4_4_ & 0xff) == 0x22) {
        psVar3 = _internal_mutable_predictedfeaturename_abi_cxx11_(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::InlineGreedyStringParser
                              (psVar3,(char *)ctx_local,pPStack_20);
        bVar2 = google::protobuf::internal::VerifyUTF8(psVar3,(char *)0x0);
        goto joined_r0x002a0976;
      }
      break;
    case 5:
      if ((str._4_4_ & 0xff) == 0x2a) {
        psVar3 = _internal_mutable_predictedprobabilitiesname_abi_cxx11_(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::InlineGreedyStringParser
                              (psVar3,(char *)ctx_local,pPStack_20);
        bVar2 = google::protobuf::internal::VerifyUTF8(psVar3,(char *)0x0);
        goto joined_r0x002a0976;
      }
      break;
    case 6:
      if ((str._4_4_ & 0xff) == 0x32) {
        ctx_local = (ParseContext *)((long)&ctx_local[-1].data_.arena + 7);
        do {
          pPVar1 = pPStack_20;
          ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 1);
          pFVar4 = _internal_add_state(this);
          ctx_local = (ParseContext *)
                      google::protobuf::internal::ParseContext::ParseMessage
                                (pPVar1,&pFVar4->super_MessageLite,(char *)ctx_local);
          if (ctx_local == (ParseContext *)0x0) {
            return (char *)(ParseContext *)0x0;
          }
          bVar2 = google::protobuf::internal::EpsCopyInputStream::DataAvailable
                            (&pPStack_20->super_EpsCopyInputStream,(char *)ctx_local);
        } while ((bVar2) &&
                (bVar2 = google::protobuf::internal::ExpectTag<50u>((char *)ctx_local), bVar2));
        goto LAB_002a06fc;
      }
    }
    if ((str._4_4_ == 0) || ((str._4_4_ & 7) == 4)) {
      if (ctx_local == (ParseContext *)0x0) {
        return (char *)(ParseContext *)0x0;
      }
      google::protobuf::internal::EpsCopyInputStream::SetLastTag
                (&pPStack_20->super_EpsCopyInputStream,str._4_4_);
      return (char *)ctx_local;
    }
    unknown = google::protobuf::internal::InternalMetadata::
              mutable_unknown_fields<std::__cxx11::string>
                        (&(this->super_MessageLite)._internal_metadata_);
    ctx_local = (ParseContext *)
                google::protobuf::internal::UnknownFieldParse
                          (tag_00,unknown,(char *)ctx_local,pPStack_20);
joined_r0x002a07a5:
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)(ParseContext *)0x0;
    }
  } while( true );
}

Assistant:

const char* FunctionDescription::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          auto str = _internal_mutable_name();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // repeated .CoreML.Specification.FeatureDescription input = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_input(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else
          goto handle_unusual;
        continue;
      // repeated .CoreML.Specification.FeatureDescription output = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 26)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_output(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<26>(ptr));
        } else
          goto handle_unusual;
        continue;
      // string predictedFeatureName = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          auto str = _internal_mutable_predictedfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string predictedProbabilitiesName = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 42)) {
          auto str = _internal_mutable_predictedprobabilitiesname();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // repeated .CoreML.Specification.FeatureDescription state = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 50)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_state(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<50>(ptr));
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}